

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

InterfaceSchema __thiscall capnp::Schema::asInterface(Schema *this)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if (local_40._reader.dataSize < 0x70) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(short *)((long)local_40._reader.data + 0xc) == 3;
    if (_kjCondition.value) {
      return (InterfaceSchema)(Schema)this->raw;
    }
  }
  getProto(&local_40,this);
  local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,299,FAILED,"getProto().isInterface()",
             "_kjCondition,\"Tried to use non-interface schema as an interface.\", getProto().getDisplayName()"
             ,&_kjCondition,(char (*) [51])"Tried to use non-interface schema as an interface.",
             (Reader *)&local_50);
  kj::_::Debug::Fault::~Fault(&f);
  return (InterfaceSchema)((long)capnp::_::NULL_INTERFACE_SCHEMA + 0x48);
}

Assistant:

InterfaceSchema Schema::asInterface() const {
  KJ_REQUIRE(getProto().isInterface(), "Tried to use non-interface schema as an interface.",
             getProto().getDisplayName()) {
    return InterfaceSchema();
  }
  return InterfaceSchema(*this);
}